

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QDnsTextRecordPrivate>::detach_helper
          (QSharedDataPointer<QDnsTextRecordPrivate> *this)

{
  QDnsTextRecordPrivate *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  QDnsTextRecordPrivate *pQVar3;
  
  iVar2 = clone(this,in_RSI,in_RDX,in_ECX,in_R8);
  pQVar3 = (QDnsTextRecordPrivate *)CONCAT44(extraout_var,iVar2);
  LOCK();
  (pQVar3->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar3->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
                   .super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QDnsRecordPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QDnsTextRecordPrivate *)0x0) {
      QDnsTextRecordPrivate::~QDnsTextRecordPrivate(pQVar1);
    }
    operator_delete(pQVar1,0x40);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}